

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_number(LexState *ls,TValue *tv)

{
  LexChar LVar1;
  byte *pbVar2;
  lua_State *L_00;
  TValue *pTVar3;
  uint64_t uVar4;
  undefined2 uVar5;
  StrScanFmt SVar6;
  SBuf *pSVar7;
  bool bVar8;
  uint local_15c;
  uint local_154;
  ptrdiff_t oldtop;
  GCcdata *cd;
  lua_State *L;
  uint local_130;
  LexChar xp;
  LexChar c;
  StrScanFmt fmt;
  TValue *tv_local;
  LexState *ls_local;
  GCcdata *cd_2;
  GCcdata *cd_1;
  char *w;
  char *w_1;
  char *w_2;
  char *local_40;
  char *local_28;
  char *local_10;
  
  L._4_4_ = 0x65;
  local_130 = ls->c;
  if (local_130 == 0x30) {
    LVar1 = ls->c;
    pSVar7 = &ls->sb;
    if ((int)(ls->sb).e == (int)pSVar7->w) {
      local_10 = lj_buf_more2(pSVar7,1);
    }
    else {
      local_10 = pSVar7->w;
    }
    *local_10 = (char)LVar1;
    pSVar7->w = local_10 + 1;
    if (ls->p < ls->pe) {
      pbVar2 = (byte *)ls->p;
      ls->p = (char *)(pbVar2 + 1);
      local_154 = (uint)*pbVar2;
    }
    else {
      local_154 = lex_more(ls);
    }
    ls->c = local_154;
    if ((local_154 | 0x20) == 0x78) {
      L._4_4_ = 0x70;
    }
  }
  while( true ) {
    bVar8 = true;
    if ((((""[(long)ls->c + 1] & 0x80) == 0) && (bVar8 = true, ls->c != 0x2e)) &&
       ((ls->c == 0x2d || (bVar8 = false, ls->c == 0x2b)))) {
      bVar8 = (local_130 | 0x20) == L._4_4_;
    }
    if (!bVar8) break;
    local_130 = ls->c;
    LVar1 = ls->c;
    pSVar7 = &ls->sb;
    if ((int)(ls->sb).e == (int)pSVar7->w) {
      local_28 = lj_buf_more2(pSVar7,1);
    }
    else {
      local_28 = pSVar7->w;
    }
    *local_28 = (char)LVar1;
    pSVar7->w = local_28 + 1;
    if (ls->p < ls->pe) {
      pbVar2 = (byte *)ls->p;
      ls->p = (char *)(pbVar2 + 1);
      local_15c = (uint)*pbVar2;
    }
    else {
      local_15c = lex_more(ls);
    }
    ls->c = local_15c;
  }
  pSVar7 = &ls->sb;
  if ((int)(ls->sb).e == (int)pSVar7->w) {
    local_40 = lj_buf_more2(pSVar7,1);
  }
  else {
    local_40 = pSVar7->w;
  }
  *local_40 = '\0';
  pSVar7->w = local_40 + 1;
  SVar6 = lj_strscan_scan((uint8_t *)(ls->sb).b,((int)(ls->sb).w - (int)(ls->sb).b) - 1,tv,0xe);
  if (SVar6 != STRSCAN_NUM) {
    if (SVar6 == STRSCAN_ERROR) {
      lj_lex_error(ls,0x11e,LJ_ERR_XNUMBER);
    }
    L_00 = ls->L;
    if (*(long *)((L_00->glref).ptr64 + 0x180) == 0) {
      pTVar3 = L_00->top;
      uVar4 = (L_00->stack).ptr64;
      luaopen_ffi(L_00);
      L_00->top = (TValue *)((long)pTVar3 + ((L_00->stack).ptr64 - uVar4));
    }
    if (SVar6 == STRSCAN_IMAG) {
      oldtop = (ptrdiff_t)lj_mem_newgco(L_00,0x20);
      *(undefined1 *)(oldtop + 9) = 10;
      *(undefined2 *)(oldtop + 10) = 0x10;
      *(undefined8 *)(oldtop + 0x10) = 0;
      *(TValue *)(oldtop + 0x18) = *tv;
    }
    else {
      uVar5 = 0xc;
      if (SVar6 == STRSCAN_I64) {
        uVar5 = 0xb;
      }
      oldtop = (ptrdiff_t)lj_mem_newgco(L_00,0x18);
      *(undefined1 *)(oldtop + 9) = 10;
      *(undefined2 *)(oldtop + 10) = uVar5;
      *(TValue *)(oldtop + 0x10) = *tv;
    }
    lj_parse_keepcdata(ls,tv,(GCcdata *)oldtop);
  }
  return;
}

Assistant:

static void lex_number(LexState *ls, TValue *tv)
{
  StrScanFmt fmt;
  LexChar c, xp = 'e';
  lj_assertLS(lj_char_isdigit(ls->c), "bad usage");
  if ((c = ls->c) == '0' && (lex_savenext(ls) | 0x20) == 'x')
    xp = 'p';
  while (lj_char_isident(ls->c) || ls->c == '.' ||
	 ((ls->c == '-' || ls->c == '+') && (c | 0x20) == xp)) {
    c = ls->c;
    lex_savenext(ls);
  }
  lex_save(ls, '\0');
  fmt = lj_strscan_scan((const uint8_t *)ls->sb.b, sbuflen(&ls->sb)-1, tv,
	  (LJ_DUALNUM ? STRSCAN_OPT_TOINT : STRSCAN_OPT_TONUM) |
	  (LJ_HASFFI ? (STRSCAN_OPT_LL|STRSCAN_OPT_IMAG) : 0));
  if (LJ_DUALNUM && fmt == STRSCAN_INT) {
    setitype(tv, LJ_TISNUM);
  } else if (fmt == STRSCAN_NUM) {
    /* Already in correct format. */
#if LJ_HASFFI
  } else if (fmt != STRSCAN_ERROR) {
    lua_State *L = ls->L;
    GCcdata *cd;
    lj_assertLS(fmt == STRSCAN_I64 || fmt == STRSCAN_U64 || fmt == STRSCAN_IMAG,
		"unexpected number format %d", fmt);
    ctype_loadffi(L);
    if (fmt == STRSCAN_IMAG) {
      cd = lj_cdata_new_(L, CTID_COMPLEX_DOUBLE, 2*sizeof(double));
      ((double *)cdataptr(cd))[0] = 0;
      ((double *)cdataptr(cd))[1] = numV(tv);
    } else {
      cd = lj_cdata_new_(L, fmt==STRSCAN_I64 ? CTID_INT64 : CTID_UINT64, 8);
      *(uint64_t *)cdataptr(cd) = tv->u64;
    }
    lj_parse_keepcdata(ls, tv, cd);
#endif
  } else {
    lj_assertLS(fmt == STRSCAN_ERROR,
		"unexpected number format %d", fmt);
    lj_lex_error(ls, TK_number, LJ_ERR_XNUMBER);
  }
}